

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O1

VmValue * CompileVmFunctionDefinition
                    (ExpressionContext *ctx,VmModule *module,ExprFunctionDefinition *node)

{
  SmallArray<VmBlock_*,_4U> *this;
  uint uVar1;
  FunctionData *pFVar2;
  VmFunction *user;
  TypeFunction *pTVar3;
  SynBase *source;
  Allocator *pAVar4;
  SynIdentifier *pSVar5;
  char *__src;
  long lVar6;
  VmFunction *pVVar7;
  VmBlock *pVVar8;
  ExprBase *expression;
  long lVar9;
  int iVar10;
  VmConstant *el0;
  VmValue *pVVar11;
  undefined4 extraout_var;
  VmBlock *pVVar12;
  VmInstruction *this_00;
  undefined4 extraout_var_00;
  uint uVar13;
  ulong uVar14;
  VmType type;
  TraceScope traceScope;
  VmValue *in_stack_ffffffffffffff80;
  VmValue *in_stack_ffffffffffffff98;
  TraceScope local_40;
  
  pFVar2 = node->function;
  user = pFVar2->vmFunction;
  if (module->skipFunctionDefinitions == true) {
    pTVar3 = pFVar2->type;
    if (pTVar3 == (TypeFunction *)0x0) {
      __assert_fail("structType",
                    "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/InstructionTreeVm.h"
                    ,0xd4,"static const VmType VmType::FunctionRef(TypeBase *)");
    }
    source = (node->super_ExprBase).source;
    el0 = CreateConstantPointer
                    (module->allocator,source,0,(VariableData *)0x0,ctx->typeNullPtr,false);
    type.structType = &pTVar3->super_TypeBase;
    type.type = VM_TYPE_FUNCTION_REF;
    type.size = 0xc;
    pVVar11 = anon_unknown.dwarf_13465d::CreateConstruct
                        (module,source,type,&el0->super_VmValue,&user->super_VmValue,(VmValue *)0x0,
                         in_stack_ffffffffffffff80);
    anon_unknown.dwarf_13465d::CheckType(ctx,&node->super_ExprBase,pVVar11);
  }
  else if (pFVar2->isPrototype == true) {
    iVar10 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
    pVVar11 = (VmValue *)CONCAT44(extraout_var,iVar10);
    pAVar4 = module->allocator;
    pVVar11->typeID = 0;
    pVVar11->source = (SynBase *)0x0;
    (pVVar11->comment).begin = (char *)0x0;
    (pVVar11->type).type = VM_TYPE_VOID;
    (pVVar11->type).size = 0;
    (pVVar11->type).structType = (TypeBase *)0x0;
    (pVVar11->comment).end = (char *)0x0;
    (pVVar11->users).allocator = pAVar4;
    (pVVar11->users).data = (pVVar11->users).little;
    (pVVar11->users).count = 0;
    (pVVar11->users).max = 8;
    pVVar11->hasSideEffects = false;
    pVVar11->hasMemoryAccess = false;
    pVVar11->canBeRemoved = true;
    pVVar11->hasKnownSimpleUse = false;
    pVVar11->hasKnownNonSimpleUse = false;
    pVVar11->_vptr_VmValue = (_func_int **)&PTR__VmValue_00249c60;
  }
  else {
    if ((CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)::token ==
         '\0') &&
       (iVar10 = __cxa_guard_acquire(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                                      ::token), iVar10 != 0)) {
      CompileVmFunctionDefinition::token =
           NULLC::TraceGetToken("InstructionTreeVm","CompileVmFunctionDefinition");
      __cxa_guard_release(&CompileVmFunctionDefinition(ExpressionContext&,VmModule*,ExprFunctionDefinition*)
                           ::token);
    }
    NULLC::TraceScope::TraceScope(&local_40,CompileVmFunctionDefinition::token);
    lVar9 = NULLC::traceContext;
    if ((user->function != (FunctionData *)0x0) &&
       (pSVar5 = user->function->name, pSVar5 != (SynIdentifier *)0x0)) {
      __src = (pSVar5->name).begin;
      uVar14 = (long)(pSVar5->name).end - (long)__src;
      iVar10 = (int)uVar14;
      if (iVar10 != 0) {
        uVar13 = iVar10 + 1;
        if ((*(uint *)(NULLC::traceContext + 0x264) <=
             *(int *)(NULLC::traceContext + 0x260) + uVar13) ||
           (*(int *)(NULLC::traceContext + 0x270) == *(int *)(NULLC::traceContext + 0x274))) {
          NULLC::TraceDump();
        }
        if (*(uint *)(lVar9 + 0x264) <= uVar13) {
          __assert_fail("count + 1 < context.labels.max",
                        "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Trace.h"
                        ,0x142,"void NULLC::TraceLabel(const char *, const char *)");
        }
        uVar1 = *(uint *)(lVar9 + 0x260);
        memcpy((void *)((ulong)uVar1 + *(long *)(lVar9 + 0x268)),__src,uVar14 & 0xffffffff);
        *(undefined1 *)(*(long *)(lVar9 + 0x268) + (ulong)(uint)(*(int *)(lVar9 + 0x260) + iVar10))
             = 0;
        *(int *)(lVar9 + 0x260) = *(int *)(lVar9 + 0x260) + uVar13;
        lVar6 = *(long *)(lVar9 + 0x278);
        uVar13 = *(uint *)(lVar9 + 0x270);
        *(uint *)(lVar9 + 0x270) = uVar13 + 1;
        *(uint *)(lVar6 + (ulong)uVar13 * 8) = uVar1 * 4 + 2;
        *(undefined4 *)(lVar6 + 4 + (ulong)uVar13 * 8) = 0;
      }
    }
    module->skipFunctionDefinitions = true;
    pVVar7 = module->currentFunction;
    pVVar8 = module->currentBlock;
    module->currentFunction = user;
    pVVar12 = anon_unknown.dwarf_13465d::CreateBlock(module,(node->super_ExprBase).source,"start");
    VmFunction::AddBlock(module->currentFunction,pVVar12);
    module->currentBlock = pVVar12;
    VmValue::AddUse(&pVVar12->super_VmValue,&user->super_VmValue);
    if (node->function->coroutine == true) {
      pVVar11 = CompileVm(ctx,module,node->coroutineStateRead);
      this_00 = anon_unknown.dwarf_13465d::CreateInstruction
                          ((anon_unknown_dwarf_13465d *)module,
                           (VmModule *)(node->super_ExprBase).source,(SynBase *)0x0,
                           (VmType)(ZEXT816(0x4c) << 0x40),(VmInstructionType)pVVar11,(VmValue *)0x0
                           ,(VmValue *)0x0,(VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff98);
      pVVar12 = anon_unknown.dwarf_13465d::CreateBlock
                          (module,(node->super_ExprBase).source,"co_start");
      VmInstruction::AddArgument(this_00,&pVVar12->super_VmValue);
      VmFunction::AddBlock(module->currentFunction,pVVar12);
      module->currentBlock = pVVar12;
      this = &user->restoreBlocks;
      uVar13 = (user->restoreBlocks).count;
      if (uVar13 == (user->restoreBlocks).max) {
        SmallArray<VmBlock_*,_4U>::grow(this,uVar13);
      }
      if (this->data == (VmBlock **)0x0) {
LAB_001b2c9d:
        __assert_fail("data",
                      "/workspace/llm4binary/github/license_c_cmakelists/WheretIB[P]nullc/NULLC/Array.h"
                      ,0x162,
                      "void SmallArray<VmBlock *, 4>::push_back(const T &) [T = VmBlock *, N = 4]");
      }
      uVar13 = (user->restoreBlocks).count;
      (user->restoreBlocks).count = uVar13 + 1;
      this->data[uVar13] = pVVar12;
      if (node->function->yieldCount != 0) {
        uVar13 = 0;
        do {
          pVVar12 = anon_unknown.dwarf_13465d::CreateBlock
                              (module,(node->super_ExprBase).source,"restore");
          VmInstruction::AddArgument(this_00,&pVVar12->super_VmValue);
          uVar1 = (user->restoreBlocks).count;
          if (uVar1 == (user->restoreBlocks).max) {
            SmallArray<VmBlock_*,_4U>::grow(this,uVar1);
          }
          if (this->data == (VmBlock **)0x0) goto LAB_001b2c9d;
          uVar1 = (user->restoreBlocks).count;
          (user->restoreBlocks).count = uVar1 + 1;
          this->data[uVar1] = pVVar12;
          uVar13 = uVar13 + 1;
        } while (uVar13 < node->function->yieldCount);
      }
    }
    for (expression = (node->expressions).head; expression != (ExprBase *)0x0;
        expression = expression->next) {
      CompileVm(ctx,module,expression);
    }
    anon_unknown.dwarf_13465d::CreateInstruction
              ((anon_unknown_dwarf_13465d *)module,(VmModule *)0x0,(SynBase *)0x0,
               (VmType)(ZEXT816(0x48) << 0x40),VM_INST_LOAD_BYTE,(VmValue *)0x0,(VmValue *)0x0,
               (VmValue *)0x0,(VmValue *)0x0,in_stack_ffffffffffffff98);
    module->currentFunction = pVVar7;
    module->currentBlock = pVVar8;
    module->skipFunctionDefinitions = false;
    iVar10 = (*module->allocator->_vptr_Allocator[2])(module->allocator,0x98);
    pVVar11 = (VmValue *)CONCAT44(extraout_var_00,iVar10);
    pAVar4 = module->allocator;
    pVVar11->typeID = 0;
    (pVVar11->type).type = VM_TYPE_VOID;
    (pVVar11->type).size = 0;
    (pVVar11->type).structType = (TypeBase *)0x0;
    pVVar11->source = (SynBase *)0x0;
    (pVVar11->comment).begin = (char *)0x0;
    (pVVar11->comment).end = (char *)0x0;
    (pVVar11->users).allocator = pAVar4;
    (pVVar11->users).data = (pVVar11->users).little;
    (pVVar11->users).count = 0;
    (pVVar11->users).max = 8;
    pVVar11->hasSideEffects = false;
    pVVar11->hasMemoryAccess = false;
    pVVar11->canBeRemoved = true;
    pVVar11->hasKnownSimpleUse = false;
    pVVar11->hasKnownNonSimpleUse = false;
    pVVar11->_vptr_VmValue = (_func_int **)&PTR__VmValue_00249c60;
    NULLC::TraceScope::~TraceScope(&local_40);
  }
  return pVVar11;
}

Assistant:

VmValue* CompileVmFunctionDefinition(ExpressionContext &ctx, VmModule *module, ExprFunctionDefinition *node)
{
	VmFunction *function = node->function->vmFunction;

	if(module->skipFunctionDefinitions)
		return CheckType(ctx, node, CreateConstruct(module, node->source, VmType::FunctionRef(node->function->type), CreateConstantPointer(module->allocator, node->source, 0, NULL, ctx.typeNullPtr, false), function, NULL, NULL));

	if(node->function->isPrototype)
		return CreateVoid(module);

	TRACE_SCOPE("InstructionTreeVm", "CompileVmFunctionDefinition");

	if(function->function && function->function->name)
		TRACE_LABEL2(function->function->name->name.begin, function->function->name->name.end);

	module->skipFunctionDefinitions = true;

	// Store state
	VmFunction *currentFunction = module->currentFunction;
	VmBlock *currentBlock = module->currentBlock;

	// Switch to new function
	module->currentFunction = function;

	VmBlock *block = CreateBlock(module, node->source, "start");

	module->currentFunction->AddBlock(block);
	module->currentBlock = block;
	block->AddUse(function);

	if(node->function->coroutine)
	{
		VmValue *state = CompileVm(ctx, module, node->coroutineStateRead);

		VmInstruction *inst = CreateInstruction(module, node->source, VmType::Void, VM_INST_UNYIELD, state, NULL, NULL, NULL);

		{
			VmBlock *block = CreateBlock(module, node->source, "co_start");

			inst->AddArgument(block);

			module->currentFunction->AddBlock(block);
			module->currentBlock = block;

			function->restoreBlocks.push_back(block);
		}

		for(unsigned i = 0; i < node->function->yieldCount; i++)
		{
			VmBlock *block = CreateBlock(module, node->source, "restore");

			inst->AddArgument(block);

			function->restoreBlocks.push_back(block);
		}
	}

	for(ExprBase *value = node->expressions.head; value; value = value->next)
		CompileVm(ctx, module, value);

	CreateAbortNoReturn(module, NULL);

	// Restore state
	module->currentFunction = currentFunction;
	module->currentBlock = currentBlock;

	module->skipFunctionDefinitions = false;

	return CreateVoid(module);
}